

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_SubDMeshFragment::ControlNetQuadBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  bool bVar1;
  ON_BoundingBox *bbox;
  undefined1 local_90 [8];
  ON_3dVector N;
  ON_3dPoint P [4];
  ON_SubDMeshFragment *this_local;
  
  bVar1 = GetControlNetQuad(this,false,(ON_3dPoint *)&N.z,(ON_3dVector *)local_90);
  if (bVar1) {
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
    ON_BoundingBox::Set(__return_storage_ptr__,3,false,4,3,&N.z,0);
  }
  else {
    memcpy(__return_storage_ptr__,&ON_BoundingBox::NanBoundingBox,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragment::ControlNetQuadBoundingBox() const
{
  ON_3dPoint P[4];
  ON_3dVector N;
  if (this->GetControlNetQuad(false, P, N))
  {
    ON_BoundingBox bbox;
    bbox.Set(3, 0, 4, 3, &P[0].x, false);
    return bbox;
  }
  return ON_BoundingBox::NanBoundingBox;
}